

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::NoteNewRevision(cmCTestBZR *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  ostringstream cmCTestLog_msg;
  long *local_1a8;
  long local_198 [2];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  LoadInfo_abi_cxx11_((string *)local_188,this);
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmCTestGlobalVC).NewRevision,(string *)local_188);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  poVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Revision after update: ",0x17);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p,
                      (this->super_cmCTestGlobalVC).NewRevision._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"   New revision of repository is: ",0x22);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,
                      (this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p,
                      (this->super_cmCTestGlobalVC).NewRevision._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBZR.cxx"
               ,0xac,(char *)local_1a8,false);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  poVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"URL = ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->URL)._M_dataplus._M_p,(this->URL)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return true;
}

Assistant:

bool cmCTestBZR::NoteNewRevision()
{
  this->NewRevision = this->LoadInfo();
  this->Log << "Revision after update: " << this->NewRevision << "\n";
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   New revision of repository is: " << this->NewRevision
                                                  << "\n");
  this->Log << "URL = " << this->URL << "\n";
  return true;
}